

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BlockDevice::GetDeviceList_abi_cxx11_(void)

{
  int iVar1;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  allocator<char> local_e9;
  value_type local_e8;
  undefined1 local_c8 [8];
  stat st;
  char sz [32];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vDevices;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI);
  sz[0x18] = '\0';
  sz[0x19] = '\0';
  sz[0x1a] = '\0';
  sz[0x1b] = '\0';
  for (; (int)sz._24_4_ < 0x10; sz._24_4_ = sz._24_4_ + 1) {
    memset(st.__glibc_reserved + 2,0,0x20);
    snprintf((char *)(st.__glibc_reserved + 2),0x20,"/dev/sd%c",(ulong)(sz._24_4_ + 0x61));
    iVar1 = stat64((char *)(st.__glibc_reserved + 2),(stat64 *)local_c8);
    if ((iVar1 == 0) && (((uint)st.st_nlink & 0xf000) == 0x6000)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,(char *)(st.__glibc_reserved + 2),&local_e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDI,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
  }
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(in_RDI);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_RDI);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  return in_RDI;
}

Assistant:

std::vector<std::string> BlockDevice::GetDeviceList()
{
    std::vector<std::string> vDevices;

#ifdef _WIN32
    for (int i = 0; i < 20; ++i)
    {
        std::string str = util::fmt(R"(\\.\PhysicalDrive%d)", i);
        HANDLE h = CreateFile(str.c_str(), 0, 0, nullptr, OPEN_EXISTING, 0, nullptr);

        if (h != INVALID_HANDLE_VALUE)
        {
            CloseHandle(h);
            vDevices.push_back(util::fmt("%d", i));
        }
    }
#elif defined(__linux__)
    for (int i = 0; i < 16; ++i)
    {
        char sz[32] = {};
        snprintf(sz, sizeof(sz), "/dev/sd%c", 'a' + i);

        struct stat st;
        if (!stat(sz, &st) && S_ISBLK(st.st_mode))
            vDevices.push_back(sz);
    }
#else
    CFMutableDictionaryRef matchingDict = IOServiceMatching(kIOMediaClass);
    if (matchingDict != nullptr)
    {
        CFDictionarySetValue(matchingDict, CFSTR(kIOMediaWholeKey), kCFBooleanTrue);    // whole disk objects only

        io_iterator_t iter;
        if (IOServiceGetMatchingServices(kIOMasterPortDefault, matchingDict, &iter) == KERN_SUCCESS)
        {
            for (io_object_t nextMedia; (nextMedia = IOIteratorNext(iter)); IOObjectRelease(nextMedia))
            {
                auto deviceRef = static_cast<CFStringRef>(IORegistryEntryCreateCFProperty(nextMedia, CFSTR(kIOBSDNameKey), kCFAllocatorDefault, 0));
                if (!deviceRef)
                    continue;

                CFMutableStringRef pathRef = CFStringCreateMutable(kCFAllocatorDefault, 0);
                CFStringAppend(pathRef, CFSTR(_PATH_DEV));
                CFStringAppend(pathRef, deviceRef);

                char bsdPath[PATH_MAX];
                CFStringGetCString(pathRef, bsdPath, PATH_MAX, kCFStringEncodingUTF8);
                vDevices.push_back(bsdPath);

                CFRelease(pathRef);
                CFRelease(deviceRef);
            }
        }
    }
#endif

    // Sort the list and return it
    std::sort(vDevices.begin(), vDevices.end());
    return vDevices;
}